

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thief.c
# Opt level: O1

void do_backstab(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  CHAR_DATA *victim;
  OBJ_DATA *pOVar7;
  char *pcVar8;
  CClass *this;
  char *pcVar9;
  long lVar10;
  char buf [4608];
  char arg [4608];
  
  one_argument(argument,arg);
  iVar3 = get_skill(ch,(int)gsn_backstab);
  if (iVar3 < 2) {
    pcVar9 = "You don\'t know how to backstab.\n\r";
LAB_003508ee:
    send_to_char(pcVar9,ch);
    return;
  }
  if (arg[0] == '\0') {
    pcVar9 = "Backstab whom?\n\r";
    goto LAB_003508ee;
  }
  victim = get_char_room(ch,arg);
  if (victim == (CHAR_DATA *)0x0) {
    pcVar9 = "They aren\'t here.\n\r";
    goto LAB_003508ee;
  }
  if ((ch->fighting != (CHAR_DATA *)0x0) || (victim->fighting != (CHAR_DATA *)0x0)) {
    pcVar9 = "You\'re facing the wrong end.\n\r";
    goto LAB_003508ee;
  }
  if (victim == ch) {
    pcVar9 = "How can you sneak up on yourself?\n\r";
    goto LAB_003508ee;
  }
  pOVar7 = get_eq_char(ch,0x10);
  if (pOVar7 == (OBJ_DATA *)0x0) {
    pcVar9 = "You must be wielding a weapon to backstab.\n\r";
    goto LAB_003508ee;
  }
  if ((pOVar7->value[0] != 2) &&
     ((pOVar7 = get_eq_char(ch,0x12), pOVar7 == (OBJ_DATA *)0x0 || (pOVar7->value[0] != 2)))) {
    pcVar9 = "You must be wielding a dagger to backstab.\n\r";
    goto LAB_003508ee;
  }
  bVar2 = is_safe(ch,victim);
  if (bVar2) {
    return;
  }
  bVar2 = check_sidestep(ch,victim,(int)gsn_backstab,0x5f);
  if (bVar2) {
    return;
  }
  if ((double)victim->hit < ((double)(int)victim->max_hit * 8.5) / 10.0) {
    act("$N is hurt and suspicious ... you can\'t sneak up.",ch,(void *)0x0,victim,3);
    return;
  }
  WAIT_STATE(ch,(int)skill_table[gsn_backstab].beats);
  iVar3 = number_percent();
  iVar4 = get_skill(ch,(int)gsn_backstab);
  if (iVar3 < iVar4) {
    check_improve(ch,(int)gsn_backstab,true,1);
    bVar2 = is_npc(ch);
    if (((!bVar2) && (bVar2 = is_npc(victim), !bVar2)) && (victim->fighting == (CHAR_DATA *)0x0)) {
      iVar3 = number_range(0,1);
      if (iVar3 == 0) {
        pcVar9 = "Die, %s you backstabbing fool!";
LAB_00350af4:
        pcVar8 = pers(ch,victim);
        sprintf(buf,pcVar9,pcVar8);
      }
      else if (iVar3 == 1) {
        pcVar9 = "Help! I\'m being backstabbed by %s!";
        goto LAB_00350af4;
      }
      do_myell(victim,buf,ch);
    }
    iVar4 = (int)ch->level;
    iVar3 = 0x177;
    if (iVar4 < 0x2f) {
      iVar3 = iVar4 * 10 + -0x5a;
    }
    iVar5 = 100;
    if (0x12 < iVar4) {
      iVar5 = iVar3;
    }
    one_hit_new(ch,victim,(int)gsn_backstab,false,false,0,iVar5,(char *)0x0);
  }
  else {
    check_improve(ch,(int)gsn_backstab,false,1);
    bVar2 = is_npc(ch);
    if (((!bVar2) && (bVar2 = is_npc(victim), !bVar2)) && (victim->fighting == (CHAR_DATA *)0x0)) {
      iVar3 = number_range(0,1);
      if (iVar3 == 0) {
        pcVar9 = "Die, %s you backstabbing fool!";
LAB_00350b69:
        pcVar8 = pers(ch,victim);
        sprintf(buf,pcVar9,pcVar8);
      }
      else if (iVar3 == 1) {
        pcVar9 = "Help! I\'m being backstabbed by %s!";
        goto LAB_00350b69;
      }
      do_myell(victim,buf,ch);
    }
    damage(ch,victim,0,(int)gsn_backstab,0,true);
  }
  sVar1 = ch->level;
  lVar10 = (long)gsn_dual_backstab;
  this = char_data::Class(ch);
  iVar3 = CClass::GetIndex(this);
  if (sVar1 < *(short *)(lVar10 * 0x60 + 0x45a788 + (long)iVar3 * 2)) {
    return;
  }
  iVar3 = number_range(0,3);
  if (iVar3 == 0) {
    iVar3 = get_skill(ch,(int)gsn_dual_backstab);
    if (iVar3 == 100) {
      return;
    }
    check_improve(ch,(int)gsn_dual_backstab,false,1);
    return;
  }
  iVar3 = number_percent();
  iVar4 = get_skill(ch,(int)gsn_dual_backstab);
  if ((ch->level + iVar4) - (int)victim->level < iVar3) {
    iVar3 = 0;
    check_improve(ch,(int)gsn_dual_backstab,false,1);
    goto LAB_00350d29;
  }
  iVar3 = dice(pOVar7->value[1],pOVar7->value[2]);
  iVar4 = get_skill(ch,(int)gsn_dual_backstab);
  sVar1 = ch->level;
  if (sVar1 < 0x23) {
    iVar5 = 2;
    iVar6 = 4;
  }
  else {
    if (sVar1 < 0x28) {
      iVar5 = 2;
    }
    else {
      if (0x2c < sVar1) {
        iVar5 = 4;
        if (sVar1 < 0x32) {
          iVar6 = 6;
        }
        else {
          iVar6 = 7;
        }
        goto LAB_00350ceb;
      }
      iVar5 = 3;
    }
    iVar6 = 5;
  }
LAB_00350ceb:
  iVar5 = number_range(iVar5,iVar6);
  sVar1 = ch->damroll;
  iVar6 = get_skill(ch,(int)gsn_dual_backstab);
  iVar3 = (iVar6 * sVar1) / 100 + iVar5 * ((iVar4 * iVar3) / 100);
LAB_00350d29:
  damage_old(ch,victim,iVar3,(int)gsn_dual_backstab,0,true);
  return;
}

Assistant:

void do_backstab(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	CHAR_DATA *victim;
	OBJ_DATA *obj;
	int dam;
	char buf[MAX_STRING_LENGTH];

	one_argument(argument, arg);

	if (get_skill(ch, gsn_backstab) < 2)
	{
		send_to_char("You don't know how to backstab.\n\r", ch);
		return;
	}

	if (arg[0] == '\0')
	{
		send_to_char("Backstab whom?\n\r", ch);
		return;
	}

	victim = get_char_room(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (ch->fighting != nullptr || victim->fighting)
	{
		send_to_char("You're facing the wrong end.\n\r", ch);
		return;
	}

	if (victim == ch)
	{
		send_to_char("How can you sneak up on yourself?\n\r", ch);
		return;
	}

	obj = get_eq_char(ch, WEAR_WIELD);

	if (!obj)
	{
		send_to_char("You must be wielding a weapon to backstab.\n\r", ch);
		return;
	}

	if (obj->value[0] != WEAPON_DAGGER)
	{
		obj = get_eq_char(ch, WEAR_DUAL_WIELD);

		if (obj == nullptr || obj->value[0] != WEAPON_DAGGER)
		{
			send_to_char("You must be wielding a dagger to backstab.\n\r", ch);
			return;
		}
	}

	if (is_safe(ch, victim))
		return;

	if (check_sidestep(ch, victim, gsn_backstab, 95))
		return;

	if (victim->hit < victim->max_hit * 8.5 / 10)
	{
		act("$N is hurt and suspicious ... you can't sneak up.", ch, nullptr, victim, TO_CHAR);
		return;
	}

	WAIT_STATE(ch, skill_table[gsn_backstab].beats);

	if (number_percent() < get_skill(ch, gsn_backstab))
	{
		check_improve(ch, gsn_backstab, true, 1);

		if (!is_npc(ch) && !is_npc(victim) && victim->fighting == nullptr)
		{
			switch (number_range(0, 1))
			{
				case 0:
					sprintf(buf, "Die, %s you backstabbing fool!", pers(ch, victim));
					break;
				case 1:
					sprintf(buf, "Help! I'm being backstabbed by %s!", pers(ch, victim));
					break;
			}

			do_myell(victim, buf, ch);
		}

		one_hit_new(ch, victim, gsn_backstab, HIT_NOSPECIALS, HIT_UNBLOCKABLE, HIT_NOADD, URANGE(100, (ch->level - 9) * 10, 375), nullptr);
	}
	else
	{
		check_improve(ch, gsn_backstab, false, 1);

		if (!is_npc(ch) && !is_npc(victim) && victim->fighting == nullptr)
		{
			switch (number_range(0, 1))
			{
				case 0:
					sprintf(buf, "Die, %s you backstabbing fool!", pers(ch, victim));
					break;
				case 1:
					sprintf(buf, "Help! I'm being backstabbed by %s!", pers(ch, victim));
					break;
			}

			do_myell(victim, buf, ch);
		}

		damage(ch, victim, 0, gsn_backstab, DAM_NONE, true);
	}

	if (ch->level < skill_table[gsn_dual_backstab].skill_level[ch->Class()->GetIndex()])
		return;

	if (number_range(0, 3) == 0)
	{
		if (get_skill(ch, gsn_dual_backstab) != 100)
			check_improve(ch, gsn_dual_backstab, false, 1);

		return;
	}

	if (number_percent() > (get_skill(ch, gsn_dual_backstab) + ch->level - victim->level))
	{
		check_improve(ch, gsn_dual_backstab, false, 1);
		dam = 0;
	}
	else
	{
		dam = dice(obj->value[1], obj->value[2]) * get_skill(ch, gsn_dual_backstab) / 100;

		if (ch->level < 35)
			dam *= number_range(2, 4);
		else if (ch->level < 40)
			dam *= number_range(2, 5);
		else if (ch->level < 45)
			dam *= number_range(3, 5);
		else if (ch->level < 50)
			dam *= number_range(4, 6);
		else
			dam *= number_range(4, 7);

		dam += (ch->damroll * get_skill(ch, gsn_dual_backstab) / 100);
	}

	damage_old(ch, victim, dam, gsn_dual_backstab, DAM_NONE, true);
}